

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDComponentFilter::AcceptVertex(ON_SubDComponentFilter *this,ON_SubDVertex *v)

{
  Topology TVar1;
  bool bVar2;
  
  if (v == (ON_SubDVertex *)0x0) {
    return false;
  }
  if (this->m_bRejectVertices != false) {
    return false;
  }
  bVar2 = AcceptVertexTag(this,v->m_vertex_tag);
  if (bVar2) {
    TVar1 = this->m_vertex_topology_filter;
    if (TVar1 != Unset) {
      bVar2 = ON_SubDVertex::HasBoundaryVertexTopology(v);
      if (bVar2) {
        TVar1 = TVar1 & Boundary;
      }
      else {
        bVar2 = ON_SubDVertex::HasInteriorVertexTopology(v);
        if (bVar2) {
          TVar1 = TVar1 & Interior;
        }
        else {
          TVar1 = TVar1 & Nonmanifold;
        }
      }
      if (TVar1 == Unset) goto LAB_005f3cad;
    }
    bVar2 = true;
  }
  else {
LAB_005f3cad:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_SubDComponentFilter::AcceptVertex(const ON_SubDVertex * v) const
{
  if (m_bRejectVertices)
    return false;

  if (nullptr == v)
    return false;

  if (false == AcceptVertexTag(v->m_vertex_tag))
    return false;

  if (ON_SubDComponentFilter::Topology::Unset != m_vertex_topology_filter)
  {
    // check boundary/interior/nonmanifold
    if (v->HasBoundaryVertexTopology())
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Boundary)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
    else if (v->HasInteriorVertexTopology())
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Interior)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
    else
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Nonmanifold)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
  }

  return true;
}